

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_fed153::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  string *a;
  cmGlobalGenerator *this;
  pointer pbVar6;
  ulong uVar7;
  int iVar8;
  string_view str;
  bool all_components;
  bool exclude_from_all;
  string script;
  string component;
  Helper helper;
  undefined1 local_e3;
  bool local_e2;
  undefined1 local_e1;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  string local_80;
  undefined1 local_60 [48];
  
  local_e0._8_8_ = status;
  Helper::Helper((Helper *)(local_a0 + 0x40),status);
  std::__cxx11::string::string((string *)(local_a0 + 0x20),(string *)(local_60 + 0x10));
  uVar7 = 0;
  local_e2 = false;
  local_e3 = 0;
  iVar8 = 0;
  while( true ) {
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar1 - (long)pbVar6 >> 5) <= uVar7) break;
    bVar4 = std::operator==(pbVar6 + uVar7,"COMPONENT");
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((bVar4) &&
       (uVar7 + 1 <
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))) {
      std::__cxx11::string::_M_assign((string *)(local_a0 + 0x20));
      iVar8 = iVar8 + 1;
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    }
    bVar4 = std::operator==(pbVar6 + uVar7,"EXCLUDE_FROM_ALL");
    if (bVar4) {
      local_e2 = true;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar7,"ALL_COMPONENTS");
      if (bVar4) {
        local_e3 = 1;
      }
    }
    uVar7 = uVar7 + 1;
  }
  if (iVar8 < 2) {
    if ((local_e3 & iVar8 == 1) == 0) {
      bVar2 = false;
      bVar4 = false;
      for (; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
        bVar5 = std::operator==(pbVar6,"SCRIPT");
        if (bVar5) {
          bVar4 = true;
LAB_00364573:
          bVar2 = false;
        }
        else {
          bVar5 = std::operator==(pbVar6,"CODE");
          if (bVar5) {
            bVar2 = true;
          }
          else {
            bVar5 = std::operator==(pbVar6,"COMPONENT");
            uVar3 = local_60._8_8_;
            if (bVar5) {
              bVar2 = false;
            }
            else {
              if (!bVar4) {
                if (bVar2) {
                  local_e0[0] = 1;
                  cmMakefile::GetBacktrace((cmMakefile *)local_c0);
                  std::
                  make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0,(bool *)pbVar6,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,(bool *)(local_a0 + 0x20),&local_e2,
                             (cmListFileBacktrace *)&local_e3);
                  local_d0._0_8_ = local_a0._0_8_;
                  local_a0._0_8_ = (long *)0x0;
                  cmMakefile::AddInstallGenerator
                            ((cmMakefile *)uVar3,
                             (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                              *)local_d0);
                  if ((long *)local_d0._0_8_ != (long *)0x0) {
                    (**(code **)(*(long *)local_d0._0_8_ + 8))();
                  }
                  local_d0._0_8_ = 0;
                  if ((long *)local_a0._0_8_ != (long *)0x0) {
                    (**(code **)(*(long *)local_a0._0_8_ + 8))();
                  }
                  local_a0._0_8_ = (long *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
                  goto LAB_00364573;
                }
                goto LAB_003646e1;
              }
              std::__cxx11::string::string((string *)local_c0,(string *)pbVar6);
              str._M_str = (char *)local_c0._0_8_;
              str._M_len = local_c0._8_8_;
              bVar4 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<INSTALL_PREFIX>");
              if (!bVar4) {
                bVar4 = cmsys::SystemTools::FileIsFullPath((string *)local_c0);
                if (!bVar4) {
                  a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)local_60._8_8_)
                  ;
                  local_e0[0] = 0x2f;
                  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                            ((string *)local_a0,a,local_e0,pbVar6);
                  std::__cxx11::string::operator=((string *)local_c0,(string *)local_a0);
                  std::__cxx11::string::~string((string *)local_a0);
                }
                bVar4 = cmsys::SystemTools::FileIsDirectory((string *)local_c0);
                if (bVar4) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_a0,"given a directory as value of SCRIPT argument.",
                             (allocator<char> *)local_e0);
                  std::__cxx11::string::_M_assign((string *)(local_e0._8_8_ + 8));
                  std::__cxx11::string::~string((string *)local_a0);
                  goto LAB_003647ef;
                }
              }
              uVar3 = local_60._8_8_;
              local_e1 = 0;
              cmMakefile::GetBacktrace((cmMakefile *)local_a0);
              std::
              make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(bool *)local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e1,(bool *)(local_a0 + 0x20),&local_e2,
                         (cmListFileBacktrace *)&local_e3);
              local_d0._8_8_ = local_e0._0_8_;
              local_e0._0_8_ = (long *)0x0;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)uVar3,
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )(local_d0 + 8));
              if ((long *)local_d0._8_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_d0._8_8_ + 8))();
              }
              local_d0._8_8_ = 0;
              if ((long *)local_e0._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_e0._0_8_ + 8))();
              }
              local_e0._0_8_ = (long *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
              std::__cxx11::string::~string((string *)local_c0);
            }
          }
          bVar4 = false;
        }
LAB_003646e1:
      }
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c0,"given no value for SCRIPT argument.",
                   (allocator<char> *)local_a0);
        std::__cxx11::string::_M_assign((string *)(local_e0._8_8_ + 8));
      }
      else {
        if (!bVar2) {
          this = cmMakefile::GetGlobalGenerator((cmMakefile *)local_60._8_8_);
          bVar4 = true;
          cmGlobalGenerator::AddInstallComponent(this,(string *)(local_a0 + 0x20));
          goto LAB_003647fb;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c0,"given no value for CODE argument.",
                   (allocator<char> *)local_a0);
        std::__cxx11::string::_M_assign((string *)(local_e0._8_8_ + 8));
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c0,"ALL_COMPONENTS and COMPONENT are mutually exclusive",
                 (allocator<char> *)local_a0);
      std::__cxx11::string::_M_assign((string *)(local_e0._8_8_ + 8));
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,(allocator<char> *)local_a0);
    std::__cxx11::string::_M_assign((string *)(local_e0._8_8_ + 8));
  }
LAB_003647ef:
  std::__cxx11::string::~string((string *)local_c0);
  bVar4 = false;
LAB_003647fb:
  std::__cxx11::string::~string((string *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  return bVar4;
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmHasLiteralPrefix(script, "$<INSTALL_PREFIX>")) {
        if (!cmSystemTools::FileIsFullPath(script)) {
          script =
            cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
        }
        if (cmSystemTools::FileIsDirectory(script)) {
          status.SetError("given a directory as value of SCRIPT argument.");
          return false;
        }
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}